

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O0

lzma_ret lzma_delta_coder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters)

{
  lzma_next_coder *__dest;
  uint64_t uVar1;
  lzma_options_delta *opt;
  undefined8 local_70;
  lzma_next_coder *local_30;
  lzma_delta_coder *coder;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  local_30 = (lzma_next_coder *)next->coder;
  coder = (lzma_delta_coder *)filters;
  filters_local = (lzma_filter_info *)allocator;
  allocator_local = (lzma_allocator *)next;
  if (local_30 == (lzma_next_coder *)0x0) {
    __dest = (lzma_next_coder *)lzma_alloc(0x158,allocator);
    if (__dest == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = (_func_void_ptr_void_ptr_size_t_size_t *)__dest;
    allocator_local[1].free = delta_coder_end;
    local_30 = __dest;
    memset(&opt,0,0x48);
    local_70 = 0xffffffffffffffff;
    memcpy(__dest,&opt,0x48);
  }
  uVar1 = lzma_delta_coder_memusage((void *)(coder->next).init);
  if (uVar1 == 0xffffffffffffffff) {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  else {
    local_30[1].coder = (void *)(ulong)*(uint *)((coder->next).init + 4);
    *(undefined1 *)&local_30[1].id = 0;
    memset((void *)((long)&local_30[1].id + 1),0,0x100);
    next_local._4_4_ =
         lzma_next_filter_init
                   (local_30,(lzma_allocator *)filters_local,(lzma_filter_info *)&(coder->next).code
                   );
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_delta_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters)
{
	// Allocate memory for the decoder if needed.
	lzma_delta_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_delta_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;

		// End function is the same for encoder and decoder.
		next->end = &delta_coder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Validate the options.
	if (lzma_delta_coder_memusage(filters[0].options) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Set the delta distance.
	const lzma_options_delta *opt = filters[0].options;
	coder->distance = opt->dist;

	// Initialize the rest of the variables.
	coder->pos = 0;
	memzero(coder->history, LZMA_DELTA_DIST_MAX);

	// Initialize the next decoder in the chain, if any.
	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}